

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyn_tbl.cpp
# Opt level: O0

longlong dyn_tbl_up_estimate(dyn_tbl_t *dyn_tbl,uchar *key_str)

{
  bool bVar1;
  mapped_type *pmVar2;
  void *in_RSI;
  long in_RDI;
  undefined1 auVar3 [16];
  undefined1 in_ZMM0 [64];
  double bias;
  dyn_tbl_key_t key;
  longlong ret;
  unordered_map<dyn_tbl_key_s,_long_long,_dyn_tbl_key_hash,_dyn_tbl_key_eq,_std::allocator<std::pair<const_dyn_tbl_key_s,_long_long>_>_>
  *in_stack_ffffffffffffffb8;
  unordered_map<dyn_tbl_key_s,_long_long,_dyn_tbl_key_hash,_dyn_tbl_key_eq,_std::allocator<std::pair<const_dyn_tbl_key_s,_long_long>_>_>
  *in_stack_ffffffffffffffc0;
  _Node_iterator_base<std::pair<const_dyn_tbl_key_s,_long_long>,_true> local_38;
  _Node_iterator_base<std::pair<const_dyn_tbl_key_s,_long_long>,_true> local_30;
  undefined1 local_25 [13];
  long local_18;
  void *local_10;
  long local_8;
  
  auVar3 = in_ZMM0._0_16_;
  local_18 = 0;
  local_10 = in_RSI;
  local_8 = in_RDI;
  memset(local_25,0,0xd);
  memcpy(local_25,local_10,(ulong)(*(uint *)(local_8 + 0x58) >> 3));
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<dyn_tbl_key_s,_long_long,_dyn_tbl_key_hash,_dyn_tbl_key_eq,_std::allocator<std::pair<const_dyn_tbl_key_s,_long_long>_>_>
       ::find(in_stack_ffffffffffffffb8,(key_type *)0x103c25);
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<dyn_tbl_key_s,_long_long,_dyn_tbl_key_hash,_dyn_tbl_key_eq,_std::allocator<std::pair<const_dyn_tbl_key_s,_long_long>_>_>
       ::end(in_stack_ffffffffffffffb8);
  bVar1 = std::__detail::operator!=(&local_30,&local_38);
  if (bVar1) {
    pmVar2 = std::
             unordered_map<dyn_tbl_key_s,_long_long,_dyn_tbl_key_hash,_dyn_tbl_key_eq,_std::allocator<std::pair<const_dyn_tbl_key_s,_long_long>_>_>
             ::operator[](in_stack_ffffffffffffffc0,(key_type *)in_stack_ffffffffffffffb8);
    local_18 = *pmVar2;
  }
  auVar3 = vcvtusi2sd_avx512f(auVar3,*(undefined4 *)(local_8 + 0x44));
  return (long)((double)local_18 + auVar3._0_8_);
}

Assistant:

long long dyn_tbl_up_estimate(dyn_tbl_t* dyn_tbl, unsigned char* key_str) {
	long long ret = 0;
	dyn_tbl_key_t key;
	memset(key.key, 0, sizeof(key.key));
	memcpy(key.key, key_str, dyn_tbl->lgn / 8);

	if (dyn_tbl->array.find(key) != dyn_tbl->array.end()) {
		ret = dyn_tbl->array[key];
	}
	double bias = dyn_tbl->decrement;
	return ret + bias;
}